

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_terrain.cpp
# Opt level: O0

void SetSplashDefaults(FSplashDef *splashdef)

{
  FSoundID *other;
  FSplashDef *splashdef_local;
  
  other = FSoundID::operator=(&splashdef->NormalSplashSound,(char *)0x0);
  FSoundID::operator=(&splashdef->SmallSplashSound,other);
  splashdef->SplashChunk = (PClassActor *)0x0;
  splashdef->SplashBase = (PClassActor *)0x0;
  splashdef->SmallSplash = (PClassActor *)0x0;
  splashdef->ChunkZVelShift = '\b';
  splashdef->ChunkYVelShift = '\b';
  splashdef->ChunkXVelShift = '\b';
  splashdef->ChunkBaseZVel = 1.0;
  splashdef->SmallSplashClip = 12.0;
  splashdef->NoAlert = false;
  return;
}

Assistant:

static void SetSplashDefaults (FSplashDef *splashdef)
{
	splashdef->SmallSplashSound =
		splashdef->NormalSplashSound = 0;
	splashdef->SmallSplash =
		splashdef->SplashBase =
		splashdef->SplashChunk = NULL;
	splashdef->ChunkXVelShift =
		splashdef->ChunkYVelShift =
		splashdef->ChunkZVelShift = 8;
	splashdef->ChunkBaseZVel = 1;
	splashdef->SmallSplashClip = 12.;
	splashdef->NoAlert = false;
}